

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

size_t __thiscall adios2::core::Engine::CurrentStep(Engine *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CurrentStep",&local_31);
  ThrowUp(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

size_t Engine::CurrentStep() const
{
    ThrowUp("CurrentStep");
    return 0;
}